

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocate.c
# Opt level: O1

void dmrC_allocator_transfer(allocator *A,allocator *transfer_to)

{
  size_t sVar1;
  uint uVar2;
  
  if (transfer_to->blobs_ != (allocation_blob *)0x0) {
    __assert_fail("transfer_to->blobs_ == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]dmr_c/src/allocate.c"
                  ,0x99,"void dmrC_allocator_transfer(struct allocator *, struct allocator *)");
  }
  if (transfer_to->freelist_ == (void *)0x0) {
    transfer_to->blobs_ = A->blobs_;
    sVar1 = A->total_bytes;
    transfer_to->allocations = A->allocations;
    transfer_to->total_bytes = sVar1;
    transfer_to->useful_bytes = A->useful_bytes;
    transfer_to->freelist_ = A->freelist_;
    uVar2 = A->chunking_;
    transfer_to->alignment_ = A->alignment_;
    transfer_to->chunking_ = uVar2;
    transfer_to->size_ = A->size_;
    A->blobs_ = (allocation_blob *)0x0;
    A->freelist_ = (void *)0x0;
    A->allocations = 0;
    A->total_bytes = 0;
    A->useful_bytes = 0;
    return;
  }
  __assert_fail("transfer_to->freelist_ == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]dmr_c/src/allocate.c"
                ,0x9a,"void dmrC_allocator_transfer(struct allocator *, struct allocator *)");
}

Assistant:

void dmrC_allocator_transfer(struct allocator *A, struct allocator *transfer_to) {
  assert(transfer_to->blobs_ == NULL);
  assert(transfer_to->freelist_ == NULL);
  transfer_to->blobs_ = A->blobs_;
  transfer_to->allocations = A->allocations;
  transfer_to->total_bytes = A->total_bytes;
  transfer_to->useful_bytes = A->useful_bytes;
  transfer_to->freelist_ = A->freelist_;
  transfer_to->alignment_ = A->alignment_;
  transfer_to->chunking_ = A->chunking_;
  transfer_to->size_ = A->size_;
  A->blobs_ = NULL;
  A->allocations = 0;
  A->total_bytes = 0;
  A->useful_bytes = 0;
  A->freelist_ = NULL;
}